

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

string * __thiscall
Function::getXInputName_abi_cxx11_(string *__return_storage_ptr__,Function *this)

{
  long lVar1;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  Function *local_18;
  Function *this_local;
  string *name;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Function *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (this->eType == INPUT_X) {
    std::operator+(&local_60,&this->sName,", ");
    Unit::getName_abi_cxx11_(&local_90,&(this->super_Physical).physicalUnit);
    std::operator+(&local_40,&local_60,&local_90);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_60);
  }
  lVar1 = std::__cxx11::string::length();
  if ((lVar1 == 0) && (this->xLeft != (Function *)0x0)) {
    getXInputName_abi_cxx11_(&local_b0,this->xLeft);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  lVar1 = std::__cxx11::string::length();
  if ((lVar1 == 0) && (this->xRight != (Function *)0x0)) {
    getXInputName_abi_cxx11_(&local_d0,this->xRight);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  lVar1 = std::__cxx11::string::length();
  if ((lVar1 == 0) && (this->xPlus != (Function *)0x0)) {
    getXInputName_abi_cxx11_(&local_f0,this->xPlus);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

string Function::getXInputName()
{
	string name;
	if (eType == INPUT_X)
		name = sName + ", " + physicalUnit.getName();
	if (!name.length() && xLeft)
		name = xLeft->getXInputName();
	if (!name.length() && xRight)
		name = xRight->getXInputName();
	if (!name.length() && xPlus)
		name = xPlus->getXInputName();
	return name;
}